

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

int QObject::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  MethodType MVar2;
  int iVar3;
  int iVar4;
  QMetaObject *pQVar5;
  char *pcVar6;
  undefined4 extraout_var;
  char *pcVar7;
  undefined4 extraout_var_00;
  int *piVar8;
  undefined8 uVar9;
  undefined4 extraout_var_01;
  QObject *in_RCX;
  undefined4 in_register_00000014;
  QMetaMethod *this;
  undefined4 in_register_0000003c;
  QMetaMethod *in_R8;
  int in_R9D;
  char *pcVar10;
  long in_FS_OFFSET;
  int method_index;
  int signal_index;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_70;
  int dummy;
  int local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  this = (QMetaMethod *)CONCAT44(in_register_00000014,__len);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RCX == (QObject *)0x0 || __addr == (sockaddr *)0x0) ||
      (MVar2 = QMetaMethod::methodType(this), MVar2 != Signal)) ||
     (MVar2 = QMetaMethod::methodType(in_R8), MVar2 == Constructor)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_44 = 0;
      dummy = 2;
      local_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      local_40 = lcConnect::category.name;
      if (__addr == (sockaddr *)0x0) {
        pcVar6 = "(nullptr)";
      }
      else {
        pQVar5 = (QMetaObject *)(*(code *)**(undefined8 **)__addr)(__addr);
        pcVar6 = QMetaObject::className(pQVar5);
      }
      QMetaMethod::methodSignature((QByteArray *)&local_70,this);
      pcVar10 = local_70.ptr;
      if (local_70.ptr == (char *)0x0) {
        pcVar10 = &QByteArray::_empty;
      }
      if (in_RCX == (QObject *)0x0) {
        pcVar7 = "(nullptr)";
      }
      else {
        iVar3 = (**in_RCX->_vptr_QObject)();
        pcVar7 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar3));
      }
      QMetaMethod::methodSignature((QByteArray *)&local_88,in_R8);
      if (local_88.ptr == (char *)0x0) {
        local_88.ptr = &QByteArray::_empty;
      }
      QMessageLogger::warning
                ((QMessageLogger *)&dummy,"QObject::connect: Cannot connect %s::%s to %s::%s",pcVar6
                 ,pcVar10,pcVar7,local_88.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    }
    *(undefined8 *)CONCAT44(in_register_0000003c,__fd) = 0;
    goto LAB_0028c0a6;
  }
  signal_index = -0x55555556;
  method_index = -0x55555556;
  dummy = -0x55555556;
  QMetaObjectPrivate::memberIndexes((QObject *)__addr,this,&signal_index,&dummy);
  QMetaObjectPrivate::memberIndexes(in_RCX,in_R8,&dummy,&method_index);
  pQVar5 = (QMetaObject *)(*(code *)**(undefined8 **)__addr)(__addr);
  iVar4 = (**in_RCX->_vptr_QObject)();
  iVar3 = signal_index;
  if (signal_index == -1) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      dummy = 2;
      local_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      local_44 = 0;
      local_40 = lcConnect::category.name;
      QMetaMethod::methodSignature((QByteArray *)&local_70,this);
      pcVar6 = QMetaObject::className(pQVar5);
      if (local_70.ptr == (char *)0x0) {
        local_70.ptr = &QByteArray::_empty;
      }
      QMessageLogger::warning
                ((QMessageLogger *)&dummy,
                 "QObject::connect: Can\'t find signal %s on instance of class %s",local_70.ptr,
                 pcVar6);
      goto LAB_0028c395;
    }
LAB_0028c3a3:
    uVar9 = 0;
  }
  else {
    if (method_index == -1) {
      lcConnect();
      if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
      goto LAB_0028c3a3;
      dummy = 2;
      local_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      local_44 = 0;
      local_40 = lcConnect::category.name;
      QMetaMethod::methodSignature((QByteArray *)&local_70,in_R8);
      pcVar6 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar4));
      if (local_70.ptr == (char *)0x0) {
        local_70.ptr = &QByteArray::_empty;
      }
      QMessageLogger::warning
                ((QMessageLogger *)&dummy,
                 "QObject::connect: Can\'t find method %s on instance of class %s",local_70.ptr,
                 pcVar6);
LAB_0028c395:
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    }
    else {
      QMetaMethod::methodSignature((QByteArray *)&dummy,this);
      pcVar6 = (char *)CONCAT44(uStack_4c,uStack_50);
      QMetaMethod::methodSignature((QByteArray *)&local_70,in_R8);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = &QByteArray::_empty;
      }
      pcVar10 = local_70.ptr;
      if (local_70.ptr == (char *)0x0) {
        pcVar10 = &QByteArray::_empty;
      }
      bVar1 = QMetaObject::checkConnectArgs(pcVar6,pcVar10);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dummy);
      if (!bVar1) {
        lcConnect();
        if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
        goto LAB_0028c3a3;
        dummy = 2;
        local_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        local_44 = 0;
        local_40 = lcConnect::category.name;
        pcVar6 = QMetaObject::className(pQVar5);
        QMetaMethod::methodSignature((QByteArray *)&local_70,this);
        if (local_70.ptr == (char *)0x0) {
          local_70.ptr = &QByteArray::_empty;
        }
        pcVar10 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar4));
        QMetaMethod::methodSignature((QByteArray *)&local_88,in_R8);
        if (local_88.ptr == (char *)0x0) {
          local_88.ptr = &QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((QMessageLogger *)&dummy,
                   "QObject::connect: Incompatible sender/receiver arguments\n        %s::%s --> %s::%s"
                   ,pcVar6,local_70.ptr,pcVar10,local_88.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        goto LAB_0028c395;
      }
      if ((in_R9D != 2) || (piVar8 = queuedConnectionTypes(this), piVar8 != (int *)0x0)) {
        iVar3 = QMetaObjectPrivate::connect
                          ((int)__addr,(sockaddr *)(ulong)(uint)iVar3,(socklen_t)this->mobj);
        uVar9 = CONCAT44(extraout_var_01,iVar3);
        goto LAB_0028c3ce;
      }
    }
    uVar9 = 0;
  }
LAB_0028c3ce:
  *(undefined8 *)CONCAT44(in_register_0000003c,__fd) = uVar9;
LAB_0028c0a6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __fd;
}

Assistant:

QMetaObject::Connection QObject::connect(const QObject *sender, const QMetaMethod &signal,
                                     const QObject *receiver, const QMetaMethod &method,
                                     Qt::ConnectionType type)
{
    if (sender == nullptr
            || receiver == nullptr
            || signal.methodType() != QMetaMethod::Signal
            || method.methodType() == QMetaMethod::Constructor) {
        qCWarning(lcConnect, "QObject::connect: Cannot connect %s::%s to %s::%s",
                  sender ? sender->metaObject()->className() : "(nullptr)",
                  signal.methodSignature().constData(),
                  receiver ? receiver->metaObject()->className() : "(nullptr)",
                  method.methodSignature().constData());
        return QMetaObject::Connection(nullptr);
    }

    int signal_index;
    int method_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
        QMetaObjectPrivate::memberIndexes(receiver, method, &dummy, &method_index);
    }

    const QMetaObject *smeta = sender->metaObject();
    const QMetaObject *rmeta = receiver->metaObject();
    if (signal_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find signal %s on instance of class %s",
                  signal.methodSignature().constData(), smeta->className());
        return QMetaObject::Connection(nullptr);
    }
    if (method_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find method %s on instance of class %s",
                  method.methodSignature().constData(), rmeta->className());
        return QMetaObject::Connection(nullptr);
    }

    if (!QMetaObject::checkConnectArgs(signal.methodSignature().constData(),
                                       method.methodSignature().constData())) {
        qCWarning(lcConnect,
                  "QObject::connect: Incompatible sender/receiver arguments"
                  "\n        %s::%s --> %s::%s",
                  smeta->className(), signal.methodSignature().constData(), rmeta->className(),
                  method.methodSignature().constData());
        return QMetaObject::Connection(nullptr);
    }

    int *types = nullptr;
    if ((type == Qt::QueuedConnection) && !(types = queuedConnectionTypes(signal)))
        return QMetaObject::Connection(nullptr);

#ifndef QT_NO_DEBUG
    check_and_warn_compat(smeta, signal, rmeta, method);
#endif
    QMetaObject::Connection handle = QMetaObject::Connection(QMetaObjectPrivate::connect(
        sender, signal_index, signal.enclosingMetaObject(), receiver, method_index, nullptr, type, types));
    return handle;
}